

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O2

tmbstr MergeProperties(TidyDocImpl *doc,ctmbstr s1,ctmbstr s2)

{
  char cVar1;
  uint uVar2;
  StyleProp *pSVar3;
  StyleProp *pSVar4;
  tmbstr ptVar5;
  tmbstr ptVar6;
  tmbstr ptVar7;
  char *pcVar8;
  int iVar9;
  
  iVar9 = 0;
  pSVar3 = CreateProps(doc,(StyleProp *)0x0,s1);
  pSVar4 = CreateProps(doc,pSVar3,s2);
  for (pSVar3 = pSVar4; pSVar3 != (StyleProp *)0x0; pSVar3 = pSVar3->next) {
    uVar2 = prvTidytmbstrlen(pSVar3->name);
    iVar9 = iVar9 + uVar2 + 2;
    if (pSVar3->value != (ctmbstr)0x0) {
      uVar2 = prvTidytmbstrlen(pSVar3->value);
      iVar9 = iVar9 + uVar2 + 2;
    }
  }
  ptVar5 = (tmbstr)(*doc->allocator->vtbl->alloc)(doc->allocator,(long)iVar9 + 1);
  *ptVar5 = '\0';
  ptVar7 = ptVar5;
  for (pSVar3 = pSVar4; pSVar3 != (StyleProp *)0x0; pSVar3 = pSVar3->next) {
    pcVar8 = pSVar3->name;
    ptVar6 = ptVar7 + -1;
    do {
      ptVar7 = ptVar7 + 1;
      cVar1 = *pcVar8;
      pcVar8 = pcVar8 + 1;
      ptVar6[1] = cVar1;
      ptVar6 = ptVar6 + 1;
    } while (cVar1 != '\0');
    if (pSVar3->value != (tmbstr)0x0) {
      ptVar6[0] = ':';
      ptVar6[1] = ' ';
      pcVar8 = pSVar3->value;
      do {
        cVar1 = *pcVar8;
        pcVar8 = pcVar8 + 1;
        ptVar7[1] = cVar1;
        ptVar7 = ptVar7 + 1;
        ptVar6 = ptVar7;
      } while (cVar1 != '\0');
    }
    if (pSVar3->next == (StyleProp *)0x0) break;
    ptVar6[0] = ';';
    ptVar6[1] = ' ';
    ptVar7 = ptVar6 + 2;
  }
  while (pSVar4 != (StyleProp *)0x0) {
    pSVar3 = pSVar4->next;
    (*doc->allocator->vtbl->free)(doc->allocator,pSVar4->name);
    (*doc->allocator->vtbl->free)(doc->allocator,pSVar4->value);
    (*doc->allocator->vtbl->free)(doc->allocator,pSVar4);
    pSVar4 = pSVar3;
  }
  return ptVar5;
}

Assistant:

static tmbstr MergeProperties( TidyDocImpl* doc, ctmbstr s1, ctmbstr s2 )
{
    tmbstr s;
    StyleProp *prop;

    prop = CreateProps(doc, NULL, s1);
    prop = CreateProps(doc, prop, s2);
    s = CreatePropString(doc, prop);
    FreeStyleProps(doc, prop);
    return s;
}